

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O0

void DitherCombine8x8_C(uint8_t *dither,uint8_t *dst,int dst_stride)

{
  uint8_t uVar1;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int delta1;
  int delta0;
  int j;
  int i;
  undefined4 local_1c;
  undefined4 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
      uVar1 = clip_8b((uint)*(byte *)(local_10 + local_18) +
                      ((int)(*(byte *)(local_8 + local_18) - 0x78) >> 4));
      *(uint8_t *)(local_10 + local_18) = uVar1;
    }
    local_10 = local_10 + in_EDX;
    local_8 = local_8 + 8;
  }
  return;
}

Assistant:

static void DitherCombine8x8_C(const uint8_t* WEBP_RESTRICT dither,
                               uint8_t* WEBP_RESTRICT dst, int dst_stride) {
  int i, j;
  for (j = 0; j < 8; ++j) {
    for (i = 0; i < 8; ++i) {
      const int delta0 = dither[i] - VP8_DITHER_AMP_CENTER;
      const int delta1 =
          (delta0 + VP8_DITHER_DESCALE_ROUNDER) >> VP8_DITHER_DESCALE;
      dst[i] = clip_8b((int)dst[i] + delta1);
    }
    dst += dst_stride;
    dither += 8;
  }
}